

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Window * windowFind(Parse *pParse,Window *pList,char *zName)

{
  int iVar1;
  
  if (pList != (Window *)0x0) {
    do {
      iVar1 = sqlite3StrICmp(pList->zName,zName);
      if (iVar1 == 0) {
        return pList;
      }
      pList = pList->pNextWin;
    } while (pList != (Window *)0x0);
  }
  sqlite3ErrorMsg(pParse,"no such window: %s",zName);
  return pList;
}

Assistant:

static Window *windowFind(Parse *pParse, Window *pList, const char *zName){
  Window *p;
  for(p=pList; p; p=p->pNextWin){
    if( sqlite3StrICmp(p->zName, zName)==0 ) break;
  }
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such window: %s", zName);
  }
  return p;
}